

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O1

void do_rsset(int *ip)

{
  int iVar1;
  
  labldef(loccnt,1);
  iVar1 = evaluate(ip,';');
  if (iVar1 != 0) {
    if (0xffff < value) {
      error("Address out of range!");
      return;
    }
    rsbase = value;
    if (pass == 1) {
      loadlc(value,1);
      println();
      return;
    }
  }
  return;
}

Assistant:

void
do_rsset(int *ip)
{
	/* define label */
	labldef(loccnt, 1);

	/* get value */
	if (!evaluate(ip, ';'))
		return;
	if (value & 0xFFFF0000) {
		error("Address out of range!");
		return;
	}

	/* set 'rs' base */
	rsbase = value;

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(rsbase, 1);
		println();
	}
}